

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

void __thiscall
Analyzer::updateNearestAssignmentsAfterCheck(Analyzer *this,Node *parent,Node *n,int i)

{
  TokenType TVar1;
  pointer ppNVar2;
  bool bVar3;
  NodeType NVar4;
  int iVar5;
  ulong uVar6;
  char *__haystack;
  char *pcVar7;
  int j;
  long lVar8;
  
  updateNearestAssignments(this,n);
  if (((n->nodeType == PNT_BINARY_OP) && (uVar6 = (ulong)n->tok->type, uVar6 < 0x2b)) &&
     ((0x7a000000040U >> (uVar6 & 0x3f) & 1) != 0)) {
    bVar3 = isVarCanBeNull(this,*(n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (bVar3) {
LAB_00120243:
      TVar1 = n->tok->type;
      if ((TVar1 != TK_NEWSLOT) && (TVar1 != TK_ASSIGN)) goto LAB_00120262;
    }
    else {
      bVar3 = isVarCanBeString(this,*(n->children).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start);
      if (bVar3) goto LAB_00120243;
    }
    removeNearestAssignmentsFoundAt
              (this,*(n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
  }
LAB_00120262:
  if (parent->nodeType == PNT_IF_ELSE) {
    removeNearestAssignmentsExcludeString
              (this,(parent->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start[i]);
  }
  NVar4 = n->nodeType;
  if (NVar4 - PNT_WHILE_LOOP < 2) {
    for (lVar8 = 1;
        ppNVar2 = (n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        lVar8 < (int)((ulong)((long)(n->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppNVar2) >> 3);
        lVar8 = lVar8 + 1) {
      removeNearestAssignmentsFoundAt(this,ppNVar2[lVar8]);
    }
    NVar4 = n->nodeType;
  }
  if (NVar4 - PNT_FUNCTION_CALL < 2) {
    __haystack = getFunctionName(this,n);
    bVar3 = isTestPresentInNodePath(this,n);
    if (!bVar3) {
      pcVar7 = strstr(__haystack,"assert");
      if (pcVar7 == (char *)0x0) {
        iVar5 = strcmp(__haystack,"type");
        if (iVar5 != 0) goto LAB_0012032e;
      }
    }
    for (lVar8 = 1;
        ppNVar2 = (n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        lVar8 < (int)((ulong)((long)(n->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppNVar2) >> 3);
        lVar8 = lVar8 + 1) {
      removeNearestAssignmentsFoundAt(this,ppNVar2[lVar8]);
    }
  }
LAB_0012032e:
  if (((parent->nodeType == PNT_STATEMENT_LIST) && ((ulong)n->nodeType < 0x33)) &&
     (((0x4d1f800000000U >> ((ulong)n->nodeType & 0x3f) & 1) != 0 &&
      (nearest_assignments.
       super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       nearest_assignments.
       super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)))) {
    nearest_assignments.
    super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         nearest_assignments.
         super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void updateNearestAssignmentsAfterCheck(Node * parent, Node * n, int i)
  {
    Node * node = parent;
    updateNearestAssignments(n);

    if (n->nodeType == PNT_BINARY_OP && (n->tok.type == TK_ASSIGN || n->tok.type == TK_PLUSEQ || n->tok.type == TK_MULEQ ||
      n->tok.type == TK_MINUSEQ || n->tok.type == TK_DIVEQ || n->tok.type == TK_NEWSLOT))
    {
      if ((!isVarCanBeNull(n->children[0]) && !isVarCanBeString(n->children[0])) ||
        n->tok.type == TK_ASSIGN || n->tok.type == TK_NEWSLOT)
      {
        removeNearestAssignmentsFoundAt(n->children[0]);
      }
    }

    if (node->nodeType == PNT_IF_ELSE)
      removeNearestAssignmentsExcludeString(node->children[i]);


    if (n->nodeType == PNT_WHILE_LOOP || n->nodeType == PNT_DO_WHILE_LOOP)
    {
      for (int j = 1; j < int(n->children.size()); j++)
        removeNearestAssignmentsFoundAt(n->children[j]);
    }

    if (n->nodeType == PNT_FUNCTION_CALL || n->nodeType == PNT_FUNCTION_CALL_IF_NOT_NULL)
    {
      const char * functionName = getFunctionName(n);
      if (isTestPresentInNodePath(n) || strstr(functionName, "assert") || strcmp(functionName, "type") == 0)
        for (int j = 1; j < int(n->children.size()); j++)
          removeNearestAssignmentsFoundAt(n->children[j]);
    }


    if (node->nodeType == PNT_STATEMENT_LIST)
      if (n->nodeType == PNT_LOCAL_FUNCTION || n->nodeType == PNT_FUNCTION ||
        n->nodeType == PNT_CONTINUE || n->nodeType == PNT_BREAK || n->nodeType == PNT_RETURN ||
        n->nodeType == PNT_WHILE_LOOP || n->nodeType == PNT_DO_WHILE_LOOP ||
        n->nodeType == PNT_SWITCH_STATEMENT || n->nodeType == PNT_FOR_LOOP ||
        n->nodeType == PNT_FOR_EACH_LOOP)
      {
        nearest_assignments.clear();
      }
  }